

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalTersePrinter<const_char16_t_*>::Print(char16_t *str,ostream *os)

{
  allocator<char16_t> local_31;
  u16string local_30 [32];
  
  if (str != (char16_t *)0x0) {
    std::__cxx11::u16string::u16string<std::allocator<char16_t>>(local_30,str,&local_31);
    testing::internal::PrintU16StringTo(local_30,os);
    std::__cxx11::u16string::~u16string(local_30);
    return;
  }
  std::operator<<(os,"NULL");
  return;
}

Assistant:

static void Print(const char16_t* str, ::std::ostream* os) {
    if (str == nullptr) {
      *os << "NULL";
    } else {
      UniversalPrint(::std::u16string(str), os);
    }
  }